

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManTestStruct(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pRoot;
  word *pTruth_00;
  word *pTruth;
  Vec_Int_t *vLeaves;
  int Status;
  int nFanins;
  int iFan;
  int k;
  int i;
  int LutNDecomp [8];
  int LutCount [8];
  int nCutMax;
  Gia_Man_t *p_local;
  
  memset(LutNDecomp + 6,0,0x20);
  memset(&k,0,0x20);
  p_00 = Vec_IntAlloc(100);
  Gia_ObjComputeTruthTableStart(p,7);
  iFan = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= iFan) {
      Gia_ObjComputeTruthTableStop(p);
      printf("LUT5 = %d    ",(ulong)(uint)LutCount[3]);
      iVar1 = Abc_MaxInt(LutCount[4],1);
      printf("LUT6 = %d  NonDec = %d (%.2f %%)    ",((double)LutNDecomp[4] * 100.0) / (double)iVar1,
             (ulong)(uint)LutCount[4],(ulong)(uint)LutNDecomp[4]);
      iVar1 = Abc_MaxInt(LutCount[5],1);
      printf("LUT7 = %d  NonDec = %d (%.2f %%)    ",((double)LutNDecomp[5] * 100.0) / (double)iVar1,
             (ulong)(uint)LutCount[5],(ulong)(uint)LutNDecomp[5]);
      printf("\n");
      return;
    }
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,iFan);
      if (7 < iVar1) {
        __assert_fail("nFanins <= 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x8ff,"void Gia_ManTestStruct(Gia_Man_t *)");
      }
      iVar2 = Abc_MaxInt(iVar1,5);
      LutNDecomp[(long)iVar2 + 6] = LutNDecomp[(long)iVar2 + 6] + 1;
      if (5 < iVar1) {
        Vec_IntClear(p_00);
        for (nFanins = 0; iVar2 = Gia_ObjLutSize(p,iFan), nFanins < iVar2; nFanins = nFanins + 1) {
          piVar3 = Gia_ObjLutFanins(p,iFan);
          Vec_IntPush(p_00,piVar3[nFanins]);
        }
        pRoot = Gia_ManObj(p,iFan);
        pTruth_00 = Gia_ObjComputeTruthTableCut(p,pRoot,p_00);
        iVar2 = If_CutPerformCheck07((If_Man_t *)0x0,(uint *)pTruth_00,7,iVar1,(char *)0x0);
        if ((iVar2 != 1) && ((&k)[iVar1] = (&k)[iVar1] + 1, (&k)[iVar1] < 0xb)) {
          Kit_DsdPrintFromTruth((uint *)pTruth_00,iVar1);
          printf("\n");
        }
      }
    }
    iFan = iFan + 1;
  } while( true );
}

Assistant:

void Gia_ManTestStruct( Gia_Man_t * p )
{
    int nCutMax = 7;
    int LutCount[8] = {0}, LutNDecomp[8] = {0};
    int i, k, iFan, nFanins, Status;
    Vec_Int_t * vLeaves;
    word * pTruth;

    vLeaves = Vec_IntAlloc( 100 );
    Gia_ObjComputeTruthTableStart( p, nCutMax );
    Gia_ManForEachLut( p, i )
    {
        nFanins = Gia_ObjLutSize(p, i);
        assert( nFanins <= 7 );
        LutCount[Abc_MaxInt(nFanins, 5)]++;
        if ( nFanins <= 5 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), vLeaves );
        // check if it is decomposable
        Status = If_CutPerformCheck07( NULL, (unsigned *)pTruth, 7, nFanins, NULL );
        if ( Status == 1 )
            continue;
        LutNDecomp[nFanins]++;
        if ( LutNDecomp[nFanins] > 10 )
            continue;
        Kit_DsdPrintFromTruth( (unsigned *)pTruth, nFanins ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );

    printf( "LUT5 = %d    ", LutCount[5] );
    printf( "LUT6 = %d  NonDec = %d (%.2f %%)    ", LutCount[6], LutNDecomp[6], 100.0 * LutNDecomp[6]/Abc_MaxInt(LutCount[6], 1) );
    printf( "LUT7 = %d  NonDec = %d (%.2f %%)    ", LutCount[7], LutNDecomp[7], 100.0 * LutNDecomp[7]/Abc_MaxInt(LutCount[7], 1) );
    printf( "\n" );
}